

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_popup_begin(nk_context *ctx,nk_popup_type type,char *title,nk_flags flags,nk_rect rect)

{
  byte *pbVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  nk_window *pnVar4;
  nk_size nVar5;
  nk_panel *pnVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  nk_handle nVar9;
  nk_size nVar10;
  nk_size nVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  nk_hash nVar18;
  int iVar19;
  nk_page_element *ptr;
  nk_page_element *ptr_00;
  nk_panel *pnVar20;
  long lVar21;
  nk_rect r;
  float local_58;
  float fStack_54;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x41ad,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (title == (char *)0x0) {
    __assert_fail("title",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x41ae,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x41af,
                  "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                 );
  }
  if (pnVar4->layout != (nk_panel *)0x0) {
    if ((pnVar4->layout->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP)) !=
        NK_PANEL_NONE) {
      __assert_fail("!(panel->type & NK_PANEL_SET_POPUP) && \"popups are not allowed to have popups\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                    ,0x41b6,
                    "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
                   );
    }
    if (*title == '\0') {
      lVar21 = 0;
    }
    else {
      lVar21 = 0;
      do {
        lVar12 = lVar21 + 1;
        lVar21 = lVar21 + 1;
      } while (title[lVar12] != '\0');
    }
    nVar18 = nk_murmur_hash(title,(int)lVar21,4);
    ptr = (nk_page_element *)(pnVar4->popup).win;
    if (ptr == (nk_page_element *)0x0) {
      ptr = nk_create_page_element(ctx);
      (ptr->data).tbl.seq = ctx->seq;
      (ptr->data).win.parent = pnVar4;
      (pnVar4->popup).win = (nk_window *)ptr;
      (pnVar4->popup).active = 0;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    if ((pnVar4->popup).name != nVar18) {
      if ((pnVar4->popup).active != 0) {
        return 0;
      }
      nk_zero(ptr,0x1d8);
      (pnVar4->popup).name = nVar18;
      (pnVar4->popup).active = 1;
      (pnVar4->popup).type = NK_PANEL_POPUP;
    }
    ctx->current = (nk_window *)ptr;
    uVar2 = (pnVar4->layout->clip).x;
    uVar3 = (pnVar4->layout->clip).y;
    local_58 = rect.x;
    fStack_54 = rect.y;
    (ptr->data).win.parent = pnVar4;
    *(ulong *)((long)&ptr->data + 0x4c) = CONCAT44((float)uVar3 + fStack_54,(float)uVar2 + local_58)
    ;
    *(long *)((long)&ptr->data + 0x54) = rect._8_8_;
    (ptr->data).tbl.seq = ctx->seq;
    ptr_00 = nk_create_page_element(ctx);
    nk_zero(ptr_00,0x200);
    (ptr->data).win.layout = (nk_panel *)ptr_00;
    (ptr->data).tbl.keys[0x10] = (uint)(type == NK_POPUP_DYNAMIC) << 0xb | flags | 1;
    fVar13 = (pnVar4->buffer).clip.x;
    fVar14 = (pnVar4->buffer).clip.y;
    fVar15 = (pnVar4->buffer).clip.w;
    fVar16 = (pnVar4->buffer).clip.h;
    iVar19 = (pnVar4->buffer).use_clipping;
    uVar17 = *(undefined4 *)&(pnVar4->buffer).field_0x1c;
    nVar9 = (pnVar4->buffer).userdata;
    nVar5 = (pnVar4->buffer).begin;
    nVar10 = (pnVar4->buffer).end;
    nVar11 = (pnVar4->buffer).last;
    (ptr->data).win.buffer.base = (pnVar4->buffer).base;
    *(float *)((long)&ptr->data + 0x70) = fVar13;
    *(float *)((long)&ptr->data + 0x74) = fVar14;
    *(float *)((long)&ptr->data + 0x78) = fVar15;
    *(float *)((long)&ptr->data + 0x7c) = fVar16;
    *(int *)((long)&ptr->data + 0x80) = iVar19;
    *(undefined4 *)((long)&ptr->data + 0x84) = uVar17;
    (ptr->data).win.buffer.userdata = nVar9;
    (ptr->data).win.buffer.begin = nVar5;
    (ptr->data).win.buffer.end = nVar10;
    (ptr->data).win.buffer.last = nVar11;
    uVar17 = (undefined4)(pnVar4->buffer).end;
    uVar7 = *(undefined4 *)((long)&(pnVar4->buffer).end + 4);
    nVar5 = (pnVar4->buffer).last;
    uVar8 = *(undefined4 *)((long)&(pnVar4->buffer).last + 4);
    *(undefined4 *)&(pnVar4->popup).buf.begin = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.begin + 4) = uVar7;
    *(int *)&(pnVar4->popup).buf.parent = (int)nVar5;
    *(undefined4 *)((long)&(pnVar4->popup).buf.parent + 4) = uVar8;
    *(undefined4 *)&(pnVar4->popup).buf.last = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.last + 4) = uVar7;
    *(undefined4 *)&(pnVar4->popup).buf.end = uVar17;
    *(undefined4 *)((long)&(pnVar4->popup).buf.end + 4) = uVar7;
    (pnVar4->popup).buf.active = 1;
    nVar5 = (ctx->memory).allocated;
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&(ptr->data).win.buffer,r);
    iVar19 = nk_panel_begin(ctx,title,NK_PANEL_POPUP);
    pnVar20 = pnVar4->layout;
    if (iVar19 == 0) {
      for (; pnVar20 != (nk_panel *)0x0; pnVar20 = pnVar20->parent) {
        pbVar1 = (byte *)((long)&pnVar20->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      iVar19 = 0;
      (pnVar4->popup).buf.active = 0;
      (pnVar4->popup).active = 0;
      (ctx->memory).allocated = nVar5;
      ctx->current = pnVar4;
      nk_free_page_element(ctx,(nk_page_element *)(ptr->data).win.layout);
      (ptr->data).win.layout = (nk_panel *)0x0;
    }
    else {
      if (pnVar20 == (nk_panel *)0x0) {
        pnVar20 = (nk_panel *)0x0;
      }
      else {
        do {
          pnVar20->flags = pnVar20->flags & 0xfffeefff | 0x1000;
          pnVar20 = pnVar20->parent;
        } while (pnVar20 != (nk_panel *)0x0);
        pnVar20 = pnVar4->layout;
      }
      (pnVar4->popup).active = 1;
      pnVar6 = (ptr->data).win.layout;
      pnVar6->offset_x = (nk_uint *)((long)&ptr->data + 0x5c);
      pnVar6->offset_y = (nk_uint *)((long)&ptr->data + 0x60);
      pnVar6->parent = pnVar20;
      iVar19 = 1;
    }
    return iVar19;
  }
  __assert_fail("ctx->current->layout",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x41b0,
                "int nk_popup_begin(struct nk_context *, enum nk_popup_type, const char *, nk_flags, struct nk_rect)"
               );
}

Assistant:

NK_API int
nk_popup_begin(struct nk_context *ctx, enum nk_popup_type type,
    const char *title, nk_flags flags, struct nk_rect rect)
{
    struct nk_window *popup;
    struct nk_window *win;
    struct nk_panel *panel;

    int title_len;
    nk_hash title_hash;
    nk_size allocated;

    NK_ASSERT(ctx);
    NK_ASSERT(title);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    panel = win->layout;
    NK_ASSERT(!(panel->type & NK_PANEL_SET_POPUP) && "popups are not allowed to have popups");
    (void)panel;
    title_len = (int)nk_strlen(title);
    title_hash = nk_murmur_hash(title, (int)title_len, NK_PANEL_POPUP);

    popup = win->popup.win;
    if (!popup) {
        popup = (struct nk_window*)nk_create_window(ctx);
        popup->parent = win;
        win->popup.win = popup;
        win->popup.active = 0;
        win->popup.type = NK_PANEL_POPUP;
    }

    /* make sure we have correct popup */
    if (win->popup.name != title_hash) {
        if (!win->popup.active) {
            nk_zero(popup, sizeof(*popup));
            win->popup.name = title_hash;
            win->popup.active = 1;
            win->popup.type = NK_PANEL_POPUP;
        } else return 0;
    }

    /* popup position is local to window */
    ctx->current = popup;
    rect.x += win->layout->clip.x;
    rect.y += win->layout->clip.y;

    /* setup popup data */
    popup->parent = win;
    popup->bounds = rect;
    popup->seq = ctx->seq;
    popup->layout = (struct nk_panel*)nk_create_panel(ctx);
    popup->flags = flags;
    popup->flags |= NK_WINDOW_BORDER;
    if (type == NK_POPUP_DYNAMIC)
        popup->flags |= NK_WINDOW_DYNAMIC;

    popup->buffer = win->buffer;
    nk_start_popup(ctx, win);
    allocated = ctx->memory.allocated;
    nk_push_scissor(&popup->buffer, nk_null_rect);

    if (nk_panel_begin(ctx, title, NK_PANEL_POPUP)) {
        /* popup is running therefore invalidate parent panels */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_ROM;
            root->flags &= ~(nk_flags)NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 1;
        popup->layout->offset_x = &popup->scrollbar.x;
        popup->layout->offset_y = &popup->scrollbar.y;
        popup->layout->parent = win->layout;
        return 1;
    } else {
        /* popup was closed/is invalid so cleanup */
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.buf.active = 0;
        win->popup.active = 0;
        ctx->memory.allocated = allocated;
        ctx->current = win;
        nk_free_panel(ctx, popup->layout);
        popup->layout = 0;
        return 0;
    }
}